

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativePreciseTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::generateAndVerifyShader
               (NegativeTestContext *ctx,ShaderType shaderType,TestPrecise test)

{
  bool bVar1;
  RenderContext *renderCtx;
  TestLog *log;
  TestPrecise in_R8D;
  allocator<char> local_e1;
  string local_e0;
  int local_bc;
  char *pcStack_b8;
  int length;
  char *source;
  undefined1 local_a0 [8];
  string shaderSource;
  Shader shader;
  TestPrecise test_local;
  ShaderType shaderType_local;
  NegativeTestContext *ctx_local;
  
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  glu::Shader::Shader((Shader *)((long)&shaderSource.field_2 + 8),renderCtx,shaderType);
  NegativeTestShared::(anonymous_namespace)::generateShaderSource_abi_cxx11_
            ((string *)local_a0,(_anonymous_namespace_ *)ctx,
             (NegativeTestContext *)(ulong)shaderType,test,in_R8D);
  pcStack_b8 = (char *)std::__cxx11::string::c_str();
  local_bc = std::__cxx11::string::size();
  glu::Shader::setSources
            ((Shader *)((long)&shaderSource.field_2 + 8),1,&stack0xffffffffffffff48,&local_bc);
  glu::Shader::compile((Shader *)((long)&shaderSource.field_2 + 8));
  log = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  glu::operator<<(log,(Shader *)((long)&shaderSource.field_2 + 8));
  bVar1 = glu::Shader::getCompileStatus((Shader *)((long)&shaderSource.field_2 + 8));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Shader was not expected to compile.",&local_e1);
    NegativeTestContext::fail(ctx,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  std::__cxx11::string::~string((string *)local_a0);
  glu::Shader::~Shader((Shader *)((long)&shaderSource.field_2 + 8));
  return;
}

Assistant:

void generateAndVerifyShader (NegativeTestContext& ctx, glu::ShaderType shaderType, TestPrecise test)
{
	glu::Shader			shader			(ctx.getRenderContext(), shaderType);
	std::string			shaderSource	= generateShaderSource(ctx, shaderType, test);
	const char* const	source			= shaderSource.c_str();
	const int			length			= (int) shaderSource.size();

	shader.setSources(1, &source, &length);
	shader.compile();

	ctx.getLog() << shader;

	if (shader.getCompileStatus())
		ctx.fail("Shader was not expected to compile.");
}